

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O2

void IOCall(item *x,item *y)

{
  int c;
  int op;
  int iVar1;
  typeDesc *ptVar2;
  int iVar3;
  char *msg;
  
  ptVar2 = getType(y->typeIndex);
  switch(x->a) {
  case 0:
    if (ptVar2->index != charTypeIndex) {
      msg = "not a char in writeChar";
      goto LAB_00106f83;
    }
    if (y->mode != 0x2c2) {
      load(y);
    }
    iVar1 = y->r;
    iVar3 = 0x37;
    goto LAB_00106e0a;
  case 1:
    if (ptVar2->index != intTypeIndex) {
      msg = "not an int in writeInt";
      goto LAB_00106f83;
    }
    if (y->mode != 0x2c2) {
      load(y);
    }
    iVar1 = y->r;
    iVar3 = 0x38;
LAB_00106e0a:
    put(iVar3,0,0,iVar1);
    iVar1 = y->r;
    break;
  case 2:
    put(0x32,0x1c,0,4);
    iVar1 = getReg();
    if (ptVar2->form == 0x322) {
      if (y->hs == 0) {
        c = y->a;
        iVar3 = y->r;
        op = 0x3a;
        goto LAB_00106f10;
      }
      iVar1 = getReg();
      put(0x28,y->hs,0,3);
      put(0x3a,iVar1,y->r,y->a);
      put(0x28,0,0,2);
      put(0x39,iVar1,y->r,y->a);
      regs[x->hs] = 0;
    }
    else {
      if (ptVar2->form != 0x327) {
        msg = "bad type in fopen";
        goto LAB_00106f83;
      }
      c = y->a;
      iVar3 = y->r;
      op = 0x39;
LAB_00106f10:
      put(op,iVar1,iVar3,c);
    }
    put(0x34,iVar1,0x1c,0);
    regs[y->r] = 0;
    break;
  case 3:
    ptVar2 = getType(fileTypeIndex);
    if (ptVar2->refIndex != y->typeIndex) {
      msg = "not a file type in fclose";
      goto LAB_00106f83;
    }
    iVar1 = getReg();
    put(0x20,iVar1,y->r,y->a);
    put(0x33,iVar1,iVar1,0);
    iVar3 = 0x3b;
    goto LAB_00106e56;
  case 4:
    ptVar2 = getType(fileTypeIndex);
    if (ptVar2->refIndex != y->typeIndex) {
LAB_00106f4f:
      msg = "not a file type in feof";
LAB_00106f83:
      mark(msg);
      exit(-1);
    }
    if (y->mode != 0x2c2) {
      load(y);
    }
    iVar1 = y->r;
    put(0x33,iVar1,iVar1,0);
    iVar3 = 0x3c;
    goto LAB_00106e56;
  case 5:
    ptVar2 = getType(fileTypeIndex);
    if (ptVar2->refIndex != y->typeIndex) goto LAB_00106f4f;
    if (y->mode != 0x2c2) {
      load(y);
    }
    iVar1 = y->r;
    put(0x33,iVar1,iVar1,0);
    iVar3 = 0x3d;
LAB_00106e56:
    put(iVar3,0x1c,0,iVar1);
    break;
  case 6:
    if (ptVar2->index != charTypeIndex) {
      msg = "ord only for char";
      goto LAB_00106f83;
    }
    if (y->mode != 0x2c2) {
      load(y);
    }
    iVar1 = y->r;
    put(0x35,0x1c,0,iVar1);
    y->typeIndex = intTypeIndex;
    break;
  default:
    goto switchD_00106cfe_default;
  }
  regs[iVar1] = 0;
switchD_00106cfe_default:
  return;
}

Assistant:

procedure 
void IOCall(struct item *x, struct item *y) {
	variable struct typeDesc *type;
	variable int r; r = 0;
	type = getType(y->typeIndex);
	/* writeChar */
	if (x->a == 0) {
		if (type->index != charTypeIndex) {
			mark("not a char in writeChar");
			exit(-1);
		}
		if (y->mode != CLASS_REG) {
			load(y);
		}
		put(RISC_WRC,0,0,y->r);
		regs[y->r] = 0;

	/* writeInt */
	} elsif (x->a == 1) {
		if (type->index != intTypeIndex) {
			mark("not an int in writeInt");
			exit(-1);
		}
		if (y->mode != CLASS_REG) {
			load(y);
		}
		put(RISC_WRI,0,0,y->r);
		regs[y->r]=0;

	/* handle fopen */
	} elsif (x->a == 2) {
		put(RISC_ALL,rv,0,wordSize); 
		r = getReg();

		/* if form is string literal, then addy is on heap */
		if (type->form == FORM_STRLIT) {
			put(RISC_HFOPEN,r,y->r,y->a);
		} elsif (type->form == FORM_ARRAY) {
			if (y->hs != 0) {
				r = getReg();
				put(RISC_BEQ,y->hs,0,3); 
				put(RISC_SFOPEN,r,y->r,y->a);
				put(RISC_BEQ,0,0,2);
				put(RISC_HFOPEN,r,y->r,y->a);
				regs[x->hs] = 0;
			} else {
				put(RISC_SFOPEN,r,y->r,y->a);
			}
		} else {
			mark("bad type in fopen");
			exit(-1);
		}
		put(RISC_HSTW,r,rv,0);
		regs[y->r] = 0;
		regs[r] = 0;

	/* handle fclose */
	} elsif (x->a == 3) {
		type = getType(fileTypeIndex);
		if (type->refIndex != y->typeIndex) {
			mark("not a file type in fclose");
			exit(-1);

		/* load fd in register and close (fd is on heap) */
		} else {
			r = getReg();
			put(RISC_LDW,r,y->r,y->a);
			put(RISC_HLDW,r,r,0);
			put(RISC_FCLOSE,rv,0,r);
			regs[r] = 0;
		}
	
	/* handle feof */
	} elsif (x->a == 4) {
		type = getType(fileTypeIndex);
		if (type->refIndex != y->typeIndex) {
			mark("not a file type in feof");
			exit(-1);
		} else {
			if (y->mode != CLASS_REG) {
				load(y);
			}
			r = y->r;
			put(RISC_HLDW,r,r,0);
			put(RISC_FEOF,rv,0,r);
			regs[r] = 0;
		}

	/* handle fgetc */
	} elsif (x->a == 5) {
		type = getType(fileTypeIndex);
		if (type->refIndex != y->typeIndex) {
			mark("not a file type in feof");
			exit(-1);
		} else {
			if (y->mode != CLASS_REG) {
				load(y);
			}
			r = y->r;
			put(RISC_HLDW,r,r,0);
			put(RISC_FGETC,rv,0,r);
			regs[r] = 0;
		}
	} elsif (x->a == 6) {
		if (type->index != charTypeIndex) {
			mark("ord only for char");
			exit(-1);
		} else {
			if (y->mode != CLASS_REG) {
				load(y);
			}
			r = y->r;
			put(RISC_ORD,rv,0,r);
			y->typeIndex = intTypeIndex;
			regs[r] = 0;
		}
	}
}